

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  __m256i alVar13;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  short sVar21;
  int32_t index;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined4 uVar26;
  parasail_result_t *ppVar27;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int16_t *ptr_06;
  long lVar28;
  ulong uVar29;
  short sVar30;
  ulong uVar31;
  short sVar32;
  uint uVar33;
  __m256i *palVar34;
  uint uVar35;
  short sVar36;
  long lVar37;
  int iVar38;
  ulong size;
  undefined2 uVar39;
  undefined2 uVar40;
  undefined2 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar48 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined4 in_stack_fffffffffffffd28;
  undefined1 local_2c8 [32];
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  undefined1 local_208 [32];
  undefined1 local_198 [32];
  undefined1 auVar62 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_scan_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_stats_scan_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_scan_profile_avx2_256_16_cold_6();
      }
      else {
        uVar33 = profile->s1Len;
        if ((int)uVar33 < 1) {
          parasail_nw_stats_scan_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_scan_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_scan_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_scan_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_scan_profile_avx2_256_16_cold_1();
        }
        else {
          uVar35 = uVar33 - 1;
          size = (ulong)uVar33 + 0xf >> 4;
          uVar8 = (ulong)uVar35 % size;
          pvVar6 = (profile->profile16).matches;
          iVar38 = -open;
          iVar25 = ppVar5->min;
          iVar24 = -iVar25;
          if (iVar25 != iVar38 && SBORROW4(iVar25,iVar38) == iVar25 + open < 0) {
            iVar24 = open;
          }
          pvVar7 = (profile->profile16).similar;
          sVar21 = 0x7ffe - (short)ppVar5->max;
          ppVar27 = parasail_result_new_stats();
          if (ppVar27 != (parasail_result_t *)0x0) {
            iVar25 = (int)(uVar35 / size);
            ppVar27->flag = ppVar27->flag | 0x10210401;
            b = parasail_memalign___m256i(0x20,size);
            b_00 = parasail_memalign___m256i(0x20,size);
            b_01 = parasail_memalign___m256i(0x20,size);
            b_02 = parasail_memalign___m256i(0x20,size);
            local_2c8._0_8_ = size;
            ptr = parasail_memalign___m256i(0x20,size);
            b_03 = parasail_memalign___m256i(0x20,size);
            b_04 = parasail_memalign___m256i(0x20,size);
            b_05 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            ptr_04 = parasail_memalign___m256i(0x20,size);
            ptr_05 = parasail_memalign___m256i(0x20,size);
            ptr_06 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
            auVar50._8_8_ = 0;
            auVar50._0_8_ = b;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = b_00;
            auVar50 = vpunpcklqdq_avx(auVar50,auVar54);
            auVar42._8_8_ = 0;
            auVar42._0_8_ = b_01;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = b_02;
            auVar54 = vpunpcklqdq_avx(auVar42,auVar48);
            auVar42 = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar50;
            auVar48 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar54;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = ptr;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = b_03;
            auVar50 = vpunpcklqdq_avx(auVar49,auVar55);
            auVar56._8_8_ = 0;
            auVar56._0_8_ = b_04;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = b_05;
            auVar54 = vpunpcklqdq_avx(auVar56,auVar60);
            auVar50 = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar50;
            auVar54 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar54;
            auVar43._0_8_ = -(ulong)(auVar42._0_8_ == 0);
            auVar43._8_8_ = -(ulong)(auVar42._8_8_ == 0);
            auVar43._16_8_ = -(ulong)(auVar48._0_8_ == 0);
            auVar43._24_8_ = -(ulong)(auVar48._8_8_ == 0);
            auVar51._0_8_ = -(ulong)(auVar50._0_8_ == 0);
            auVar51._8_8_ = -(ulong)(auVar50._8_8_ == 0);
            auVar51._16_8_ = -(ulong)(auVar54._0_8_ == 0);
            auVar51._24_8_ = -(ulong)(auVar54._8_8_ == 0);
            auVar43 = vpackssdw_avx2(auVar43,auVar51);
            if (((((ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) &&
                  ptr_05 != (__m256i *)0x0) &&
                 ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) && ptr_02 != (__m256i *)0x0
                 )) && ptr_06 != (int16_t *)0x0) &&
                ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar43 >> 0x7f,0) == '\0') &&
                   (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar43 >> 0xbf,0) == '\0') &&
                 (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar43[0x1f])) {
              iVar22 = s2Len + -1;
              iVar23 = 0xf - iVar25;
              uVar39 = (undefined2)open;
              uVar40 = (undefined2)gap;
              uVar41 = (undefined2)(iVar24 - 0x7fffU);
              auVar44._0_2_ = (undefined2)size;
              auVar44._2_2_ = auVar44._0_2_;
              auVar44._4_2_ = auVar44._0_2_;
              auVar44._6_2_ = auVar44._0_2_;
              auVar44._8_2_ = auVar44._0_2_;
              auVar44._10_2_ = auVar44._0_2_;
              auVar44._12_2_ = auVar44._0_2_;
              auVar44._14_2_ = auVar44._0_2_;
              auVar44._16_2_ = auVar44._0_2_;
              auVar44._18_2_ = auVar44._0_2_;
              auVar44._20_2_ = auVar44._0_2_;
              auVar44._22_2_ = auVar44._0_2_;
              auVar44._24_2_ = auVar44._0_2_;
              auVar44._26_2_ = auVar44._0_2_;
              auVar44._28_2_ = auVar44._0_2_;
              auVar44._30_2_ = auVar44._0_2_;
              local_228 = vperm2i128_avx2(auVar44,auVar44,0x28);
              auVar45._0_2_ = (undefined2)-((int)size * gap);
              auVar45._2_2_ = auVar45._0_2_;
              auVar45._4_2_ = auVar45._0_2_;
              auVar45._6_2_ = auVar45._0_2_;
              auVar45._8_2_ = auVar45._0_2_;
              auVar45._10_2_ = auVar45._0_2_;
              auVar45._12_2_ = auVar45._0_2_;
              auVar45._14_2_ = auVar45._0_2_;
              auVar45._16_2_ = auVar45._0_2_;
              auVar45._18_2_ = auVar45._0_2_;
              auVar45._20_2_ = auVar45._0_2_;
              auVar45._22_2_ = auVar45._0_2_;
              auVar45._24_2_ = auVar45._0_2_;
              auVar45._26_2_ = auVar45._0_2_;
              auVar45._28_2_ = auVar45._0_2_;
              auVar45._30_2_ = auVar45._0_2_;
              auVar43 = vpand_avx2(auVar45,_DAT_00908de0);
              auVar45 = ZEXT432(iVar24 - 0x7fffU & 0xffff);
              auVar43 = vpaddsw_avx2(auVar45,auVar43);
              alVar13[1] = (longlong)b;
              alVar13[0] = (longlong)b_00;
              alVar13[2]._0_4_ = in_stack_fffffffffffffd28;
              alVar13[2]._4_4_ = iVar25;
              alVar13[3] = (longlong)ptr_05;
              parasail_memset___m256i(b_03,alVar13,size);
              alVar1[1] = (longlong)b;
              alVar1[0] = (longlong)b_00;
              alVar1[2]._0_4_ = in_stack_fffffffffffffd28;
              alVar1[2]._4_4_ = iVar25;
              alVar1[3] = (longlong)ptr_05;
              parasail_memset___m256i(b_04,alVar1,size);
              alVar2[1] = (longlong)b;
              alVar2[0] = (longlong)b_00;
              alVar2[2]._0_4_ = in_stack_fffffffffffffd28;
              alVar2[2]._4_4_ = iVar25;
              alVar2[3] = (longlong)ptr_05;
              parasail_memset___m256i(b_05,alVar2,size);
              alVar3[1] = (longlong)b;
              alVar3[0] = (longlong)b_00;
              alVar3[2]._0_4_ = in_stack_fffffffffffffd28;
              alVar3[2]._4_4_ = iVar25;
              alVar3[3] = (longlong)ptr_05;
              parasail_memset___m256i(b,alVar3,size);
              c[1] = (longlong)b;
              c[0] = (longlong)b_00;
              c[2]._0_4_ = in_stack_fffffffffffffd28;
              c[2]._4_4_ = iVar25;
              c[3] = (longlong)ptr_05;
              parasail_memset___m256i(b_00,c,size);
              c_00[1] = (longlong)b;
              c_00[0] = (longlong)b_00;
              c_00[2]._0_4_ = in_stack_fffffffffffffd28;
              c_00[2]._4_4_ = iVar25;
              c_00[3] = (longlong)ptr_05;
              parasail_memset___m256i(b_01,c_00,size);
              c_01[1] = (longlong)b;
              c_01[0] = (longlong)b_00;
              c_01[2]._0_4_ = in_stack_fffffffffffffd28;
              c_01[2]._4_4_ = iVar25;
              c_01[3] = (longlong)ptr_05;
              parasail_memset___m256i(b_02,c_01,size);
              auVar11._2_2_ = uVar40;
              auVar11._0_2_ = uVar40;
              auVar11._4_2_ = uVar40;
              auVar11._6_2_ = uVar40;
              auVar11._8_2_ = uVar40;
              auVar11._10_2_ = uVar40;
              auVar11._12_2_ = uVar40;
              auVar11._14_2_ = uVar40;
              auVar11._16_2_ = uVar40;
              auVar11._18_2_ = uVar40;
              auVar11._20_2_ = uVar40;
              auVar11._22_2_ = uVar40;
              auVar11._24_2_ = uVar40;
              auVar11._26_2_ = uVar40;
              auVar11._28_2_ = uVar40;
              auVar11._30_2_ = uVar40;
              auVar12._2_2_ = uVar39;
              auVar12._0_2_ = uVar39;
              auVar12._4_2_ = uVar39;
              auVar12._6_2_ = uVar39;
              auVar12._8_2_ = uVar39;
              auVar12._10_2_ = uVar39;
              auVar12._12_2_ = uVar39;
              auVar12._14_2_ = uVar39;
              auVar12._16_2_ = uVar39;
              auVar12._18_2_ = uVar39;
              auVar12._20_2_ = uVar39;
              auVar12._22_2_ = uVar39;
              auVar12._24_2_ = uVar39;
              auVar12._26_2_ = uVar39;
              auVar12._28_2_ = uVar39;
              auVar12._30_2_ = uVar39;
              auVar12 = vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar12);
              uVar31 = (ulong)((int)size - 1);
              lVar28 = uVar31 << 5;
              auVar52._8_2_ = 1;
              auVar52._0_8_ = 0x1000100010001;
              auVar52._10_2_ = 1;
              auVar52._12_2_ = 1;
              auVar52._14_2_ = 1;
              auVar52._16_2_ = 1;
              auVar52._18_2_ = 1;
              auVar52._20_2_ = 1;
              auVar52._22_2_ = 1;
              auVar52._24_2_ = 1;
              auVar52._26_2_ = 1;
              auVar52._28_2_ = 1;
              auVar52._30_2_ = 1;
              uVar29 = size;
              auVar51 = auVar52;
              do {
                *(undefined1 (*) [32])((long)*ptr_04 + lVar28) = auVar12;
                *(undefined1 (*) [32])((long)*ptr_05 + lVar28) = auVar51;
                auVar12 = vpsubsw_avx2(auVar12,auVar11);
                auVar51 = vpaddsw_avx2(auVar51,auVar52);
                lVar28 = lVar28 + -0x20;
                iVar24 = (int)uVar29;
                uVar33 = iVar24 - 1;
                uVar29 = (ulong)uVar33;
              } while (uVar33 != 0 && 0 < iVar24);
              auVar46._4_4_ = gap;
              auVar46._0_4_ = gap;
              auVar46._8_4_ = gap;
              auVar46._12_4_ = gap;
              auVar46._16_4_ = gap;
              auVar46._20_4_ = gap;
              auVar46._24_4_ = gap;
              auVar46._28_4_ = gap;
              auVar53._4_4_ = iVar38;
              auVar53._0_4_ = iVar38;
              auVar53._8_4_ = iVar38;
              auVar53._12_4_ = iVar38;
              auVar53._16_4_ = iVar38;
              auVar53._20_4_ = iVar38;
              auVar53._24_4_ = iVar38;
              auVar53._28_4_ = iVar38;
              auVar57._8_8_ = size;
              auVar57._0_8_ = size;
              auVar57._16_8_ = size;
              auVar57._24_8_ = size;
              auVar12 = vpmuldq_avx2(auVar57,_DAT_00908e00);
              auVar11 = vpmuldq_avx2(auVar57,_DAT_00908e20);
              auVar52 = vpmuldq_avx2(auVar57,_DAT_00908c60);
              auVar57 = vpmuldq_avx2(auVar57,_DAT_00908b60);
              uVar29 = 0;
              auVar51 = vpmovsxbd_avx2(ZEXT816(0x706060406040200));
              auVar58._8_4_ = 0xffff8000;
              auVar58._0_8_ = 0xffff8000ffff8000;
              auVar58._12_4_ = 0xffff8000;
              auVar58._16_4_ = 0xffff8000;
              auVar58._20_4_ = 0xffff8000;
              auVar58._24_4_ = 0xffff8000;
              auVar58._28_4_ = 0xffff8000;
              palVar34 = ptr;
              do {
                auVar66._8_8_ = uVar29;
                auVar66._0_8_ = uVar29;
                auVar66._16_8_ = uVar29;
                auVar66._24_8_ = uVar29;
                auVar62 = vpaddq_avx2(auVar66,auVar12);
                auVar70 = vpaddq_avx2(auVar66,auVar11);
                auVar67 = vpaddq_avx2(auVar66,auVar52);
                auVar66 = vpaddq_avx2(auVar66,auVar57);
                auVar66 = vpermd_avx2(auVar51,auVar66);
                auVar63 = vpermd_avx2(auVar51,auVar67);
                auVar67._0_16_ = ZEXT116(0) * auVar63._0_16_ + ZEXT116(1) * auVar66._0_16_;
                auVar67._16_16_ = ZEXT116(0) * auVar66._16_16_ + ZEXT116(1) * auVar63._0_16_;
                auVar70 = vpermd_avx2(auVar51,auVar70);
                auVar62 = vpermd_avx2(auVar51,auVar62);
                auVar50 = auVar70._0_16_;
                auVar69._0_16_ = ZEXT116(0) * auVar62._0_16_ + ZEXT116(1) * auVar50;
                auVar69._16_16_ = ZEXT116(0) * auVar70._16_16_ + ZEXT116(1) * auVar62._0_16_;
                auVar62 = vpmulld_avx2(auVar46,auVar69);
                auVar70 = vpmulld_avx2(auVar46,auVar67);
                auVar67 = vpsubd_avx2(auVar53,auVar70);
                auVar62 = vpsubd_avx2(auVar53,auVar62);
                auVar70 = vpmaxsd_avx2(auVar62,auVar58);
                auVar62 = vpmaxsd_avx2(auVar67,auVar58);
                auVar62 = vpblendw_avx2(auVar62,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
                auVar70 = vpblendw_avx2(auVar70,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
                auVar62 = vpackusdw_avx2(auVar62,auVar70);
                alVar13 = (__m256i)vpermq_avx2(auVar62,0xd8);
                *palVar34 = alVar13;
                uVar29 = uVar29 + 1;
                palVar34 = palVar34 + 1;
              } while (size != uVar29);
              *ptr_06 = 0;
              lVar28 = (ulong)(uint)s2Len - 1;
              auVar61._8_8_ = lVar28;
              auVar61._0_8_ = lVar28;
              auVar62._16_8_ = lVar28;
              auVar62._0_16_ = auVar61;
              auVar62._24_8_ = lVar28;
              auVar12 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
              auVar51 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
              uVar29 = 0;
              auVar68._8_8_ = 0x8000000000000000;
              auVar68._0_8_ = 0x8000000000000000;
              auVar50 = vpcmpeqd_avx(auVar50,auVar50);
              auVar11 = vpcmpeqd_avx2(auVar63,auVar63);
              auVar70._8_8_ = 0x8000000000000000;
              auVar70._0_8_ = 0x8000000000000000;
              auVar70._16_8_ = 0x8000000000000000;
              auVar70._24_8_ = 0x8000000000000000;
              local_248 = ZEXT1632(CONCAT412(4,CONCAT48(4,0x400000004)));
              local_208._8_4_ = 0x10;
              local_208._0_8_ = 0x1000000010;
              local_208._12_4_ = 0x10;
              local_208._16_4_ = 0x10;
              local_208._20_4_ = 0x10;
              local_208._24_4_ = 0x10;
              local_208._28_4_ = 0x10;
              do {
                auVar63._8_8_ = uVar29;
                auVar63._0_8_ = uVar29;
                auVar63._16_8_ = uVar29;
                auVar63._24_8_ = uVar29;
                auVar67 = vpor_avx2(auVar63,_DAT_00908b60);
                auVar54 = vpcmpgtq_avx(auVar67._0_16_ ^ auVar68,auVar68 ^ auVar61);
                auVar54 = vpackssdw_avx(auVar54,auVar54);
                auVar54 = vpackssdw_avx(auVar54 ^ auVar50,auVar54 ^ auVar50);
                auVar54 = vpacksswb_avx(auVar54,auVar54);
                auVar52 = vpaddd_avx2(auVar11,auVar51);
                auVar57 = vpaddd_avx2(auVar11,auVar12);
                auVar57 = vpmulld_avx2(auVar57,auVar46);
                auVar52 = vpmulld_avx2(auVar52,auVar46);
                auVar52 = vpsubd_avx2(auVar53,auVar52);
                auVar57 = vpsubd_avx2(auVar53,auVar57);
                auVar57 = vpmaxsd_avx2(auVar57,auVar58);
                auVar52 = vpmaxsd_avx2(auVar52,auVar58);
                auVar52 = vpblendw_avx2(auVar52,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
                auVar57 = vpblendw_avx2(auVar57,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
                auVar52 = vpackusdw_avx2(auVar52,auVar57);
                auVar52 = vpermq_avx2(auVar52,0xd8);
                auVar42 = auVar52._0_16_;
                if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,0);
                }
                auVar54 = vpcmpgtq_avx(auVar67._0_16_ ^ auVar68,auVar68 ^ auVar61);
                auVar54 = vpackssdw_avx(auVar54,auVar54);
                auVar54 = vpackssdw_avx(auVar54 ^ auVar50,auVar54 ^ auVar50);
                auVar54 = vpacksswb_avx(auVar54,auVar54);
                if ((auVar54 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,1);
                }
                auVar66 = auVar70 ^ auVar62;
                auVar57 = vpcmpgtq_avx2(auVar67 ^ auVar70,auVar66);
                auVar67 = vpshuflw_avx2(auVar57,0xe8);
                auVar67 = vpermd_avx2(local_248,auVar67 ^ auVar11);
                auVar54 = vpackssdw_avx(auVar67._0_16_,auVar67._0_16_);
                auVar54 = vpacksswb_avx(auVar54,auVar54);
                if ((auVar54 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,2);
                }
                auVar54 = vpackssdw_avx(auVar57._16_16_,auVar57._16_16_);
                auVar54 = vpackssdw_avx(auVar54 ^ auVar50,auVar54 ^ auVar50);
                auVar54 = vpacksswb_avx(auVar54,auVar54);
                if ((auVar54 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,3);
                }
                auVar67 = vpor_avx2(auVar63,_DAT_00908c60);
                auVar54 = vpcmpgtq_avx(auVar67._0_16_ ^ auVar68,auVar68 ^ auVar61);
                auVar54 = vpackssdw_avx(auVar54,auVar54);
                auVar57 = vpermq_avx2(ZEXT1632(auVar50 ^ auVar54),0x55);
                auVar57 = vpackssdw_avx2(auVar57,auVar46);
                auVar54 = vpacksswb_avx(auVar57._16_16_,auVar57._16_16_);
                if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,4);
                }
                auVar54 = vpcmpgtq_avx(auVar67._0_16_ ^ auVar68,auVar68 ^ auVar61);
                auVar54 = vpshufhw_avx(auVar54,0x84);
                auVar57 = vpermq_avx2(ZEXT1632(auVar50 ^ auVar54),0x55);
                auVar57 = vpackssdw_avx2(auVar57,auVar46);
                auVar54 = vpacksswb_avx(auVar57._16_16_,auVar57._16_16_);
                if ((auVar54 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,5);
                }
                auVar67 = vpcmpgtq_avx2(auVar67 ^ auVar70,auVar66);
                auVar57 = vpackssdw_avx2(auVar46,auVar67);
                auVar57 = vpackssdw_avx2(auVar11 ^ auVar57,auVar46);
                auVar54 = vpacksswb_avx(auVar57._16_16_,auVar57._16_16_);
                if ((auVar54 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,6);
                }
                auVar57 = vpackssdw_avx2(auVar46,auVar67);
                auVar57 = vpackssdw_avx2(auVar11 ^ auVar57,auVar46);
                auVar54 = vpacksswb_avx(auVar57._16_16_,auVar57._16_16_);
                if ((auVar54 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,7);
                }
                auVar57 = vpor_avx2(auVar63,_DAT_00908e20);
                auVar54 = vpcmpgtq_avx(auVar57._0_16_ ^ auVar68,auVar68 ^ auVar61);
                auVar54 = vpackssdw_avx(auVar54,auVar54);
                auVar54 = vpackssdw_avx(auVar50 ^ auVar54,auVar50 ^ auVar54);
                auVar54 = vpacksswb_avx(auVar54,auVar54);
                auVar42 = auVar52._16_16_;
                if ((auVar54 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,0);
                }
                auVar54 = vpcmpgtq_avx(auVar57._0_16_ ^ auVar68,auVar68 ^ auVar61);
                auVar54 = vpackssdw_avx(auVar54,auVar54);
                auVar54 = vpackssdw_avx(auVar50 ^ auVar54,auVar50 ^ auVar54);
                auVar54 = vpacksswb_avx(auVar54,auVar54);
                if ((auVar54 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,1);
                }
                auVar52 = vpcmpgtq_avx2(auVar57 ^ auVar70,auVar66);
                auVar57 = vpshuflw_avx2(auVar52,0xe8);
                auVar57 = vpermd_avx2(local_248,auVar11 ^ auVar57);
                auVar54 = vpackssdw_avx(auVar57._0_16_,auVar57._0_16_);
                auVar54 = vpacksswb_avx(auVar54,auVar54);
                if ((auVar54 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,2);
                }
                auVar54 = vpackssdw_avx(auVar52._16_16_,auVar52._16_16_);
                auVar54 = vpackssdw_avx(auVar50 ^ auVar54,auVar50 ^ auVar54);
                auVar54 = vpacksswb_avx(auVar54,auVar54);
                if ((auVar54 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,3);
                }
                auVar57 = vpor_avx2(auVar63,_DAT_00908e00);
                auVar54 = vpcmpgtq_avx(auVar68 ^ auVar57._0_16_,auVar68 ^ auVar61);
                auVar54 = vpackssdw_avx(auVar54,auVar54);
                auVar52 = vpermq_avx2(ZEXT1632(auVar50 ^ auVar54),0x55);
                auVar52 = vpackssdw_avx2(auVar46,auVar52);
                auVar54 = vpacksswb_avx(auVar52._16_16_,auVar52._16_16_);
                if ((auVar54 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,4);
                }
                auVar54 = vpcmpgtq_avx(auVar68 ^ auVar57._0_16_,auVar68 ^ auVar61);
                auVar54 = vpshufhw_avx(auVar54,0x84);
                auVar52 = vpermq_avx2(ZEXT1632(auVar50 ^ auVar54),0x55);
                auVar52 = vpackssdw_avx2(auVar46,auVar52);
                auVar54 = vpacksswb_avx(auVar52._16_16_,auVar52._16_16_);
                if ((auVar54 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,5);
                }
                auVar57 = vpcmpgtq_avx2(auVar70 ^ auVar57,auVar66);
                auVar52 = vpackssdw_avx2(auVar46,auVar57);
                auVar52 = vpackssdw_avx2(auVar46,auVar11 ^ auVar52);
                auVar54 = vpacksswb_avx(auVar52._16_16_,auVar52._16_16_);
                if ((auVar54 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,6);
                }
                auVar52 = vpackssdw_avx2(auVar46,auVar57);
                auVar52 = vpackssdw_avx2(auVar46,auVar11 ^ auVar52);
                auVar54 = vpacksswb_avx(auVar52._16_16_,auVar52._16_16_);
                if ((auVar54 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar42,7);
                }
                uVar29 = uVar29 + 0x10;
                auVar51 = vpaddd_avx2(auVar51,local_208);
                auVar12 = vpaddd_avx2(auVar12,local_208);
              } while ((s2Len + 0xfU & 0xfffffff0) != uVar29);
              auVar51 = vpalignr_avx2(auVar44,local_228,0xe);
              uVar29 = 0;
              local_198._2_2_ = uVar41;
              local_198._0_2_ = uVar41;
              local_198._4_2_ = uVar41;
              local_198._6_2_ = uVar41;
              local_198._8_2_ = uVar41;
              local_198._10_2_ = uVar41;
              local_198._12_2_ = uVar41;
              local_198._14_2_ = uVar41;
              local_198._16_2_ = uVar41;
              local_198._18_2_ = uVar41;
              local_198._20_2_ = uVar41;
              local_198._22_2_ = uVar41;
              local_198._24_2_ = uVar41;
              local_198._26_2_ = uVar41;
              local_198._28_2_ = uVar41;
              local_198._30_2_ = uVar41;
              auVar47 = ZEXT3264(local_198);
              auVar71 = ZEXT3264(CONCAT230(sVar21,CONCAT228(sVar21,CONCAT226(sVar21,CONCAT224(sVar21
                                                  ,CONCAT222(sVar21,CONCAT220(sVar21,CONCAT218(
                                                  sVar21,CONCAT216(sVar21,CONCAT214(sVar21,CONCAT212
                                                  (sVar21,CONCAT210(sVar21,CONCAT28(sVar21,CONCAT26(
                                                  sVar21,CONCAT24(sVar21,CONCAT22(sVar21,sVar21)))))
                                                  )))))))))));
              do {
                alVar13 = b_03[uVar31];
                alVar1 = b_04[uVar31];
                alVar2 = b_05[uVar31];
                auVar50 = SUB3216(ptr[uVar31],0);
                auVar64._0_16_ = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar47._0_16_;
                auVar64._16_16_ = ZEXT116(0) * auVar47._16_16_ + ZEXT116(1) * auVar50;
                auVar12 = vpalignr_avx2((undefined1  [32])ptr[uVar31],auVar64,0xe);
                auVar11 = vperm2i128_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar13,0x28);
                auVar11 = vpalignr_avx2((undefined1  [32])alVar13,auVar11,0xe);
                auVar44 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                auVar44 = vpalignr_avx2((undefined1  [32])alVar1,auVar44,0xe);
                auVar52 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                auVar50 = vpinsrw_avx(auVar12._0_16_,(uint)(ushort)ptr_06[uVar29],0);
                auVar52 = vpalignr_avx2((undefined1  [32])alVar2,auVar52,0xe);
                auVar12 = vpblendd_avx2(auVar12,ZEXT1632(auVar50),0xf);
                lVar37 = (long)ppVar5->mapper[(byte)s2[uVar29]] * size * 0x20;
                auVar10._2_2_ = uVar41;
                auVar10._0_2_ = uVar41;
                auVar10._4_2_ = uVar41;
                auVar10._6_2_ = uVar41;
                auVar10._8_2_ = uVar41;
                auVar10._10_2_ = uVar41;
                auVar10._12_2_ = uVar41;
                auVar10._14_2_ = uVar41;
                auVar10._16_2_ = uVar41;
                auVar10._18_2_ = uVar41;
                auVar10._20_2_ = uVar41;
                auVar10._22_2_ = uVar41;
                auVar10._24_2_ = uVar41;
                auVar10._26_2_ = uVar41;
                auVar10._28_2_ = uVar41;
                auVar10._30_2_ = uVar41;
                auVar57 = vpsubsw_avx2(auVar10,(undefined1  [32])*ptr_04);
                local_208._0_16_ = ZEXT816(0);
                local_208 = ZEXT1632(local_208._0_16_);
                lVar28 = 0;
                auVar65 = ZEXT1664((undefined1  [16])0x0);
                auVar47 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar46 = vpaddsw_avx2(auVar12,*(undefined1 (*) [32])
                                                  ((long)pvVar4 + lVar28 + lVar37));
                  auVar53 = vpaddsw_avx2(auVar11,*(undefined1 (*) [32])
                                                  ((long)pvVar6 + lVar28 + lVar37));
                  auVar12 = *(undefined1 (*) [32])((long)*ptr + lVar28);
                  auVar11 = *(undefined1 (*) [32])((long)*b_03 + lVar28);
                  auVar58 = vpaddsw_avx2(auVar44,*(undefined1 (*) [32])
                                                  ((long)pvVar7 + lVar28 + lVar37));
                  auVar44 = *(undefined1 (*) [32])((long)*b_04 + lVar28);
                  auVar57 = vpaddsw_avx2(auVar57,*(undefined1 (*) [32])((long)*ptr_04 + lVar28));
                  auVar14._8_2_ = 1;
                  auVar14._0_8_ = 0x1000100010001;
                  auVar14._10_2_ = 1;
                  auVar14._12_2_ = 1;
                  auVar14._14_2_ = 1;
                  auVar14._16_2_ = 1;
                  auVar14._18_2_ = 1;
                  auVar14._20_2_ = 1;
                  auVar14._22_2_ = 1;
                  auVar14._24_2_ = 1;
                  auVar14._26_2_ = 1;
                  auVar14._28_2_ = 1;
                  auVar14._30_2_ = 1;
                  auVar62 = vpaddsw_avx2(auVar52,auVar14);
                  auVar52 = *(undefined1 (*) [32])((long)*b_05 + lVar28);
                  auVar63 = vpcmpgtw_avx2(auVar57,auVar10);
                  auVar67 = vpblendvb_avx2(auVar47._0_32_,local_228,auVar63);
                  auVar66 = vpblendvb_avx2(auVar65._0_32_,local_248,auVar63);
                  auVar70 = vpaddsw_avx2(local_2c8,*(undefined1 (*) [32])((long)*ptr_05 + lVar28));
                  local_208 = vpblendvb_avx2(local_208,auVar70,auVar63);
                  auVar18._2_2_ = uVar39;
                  auVar18._0_2_ = uVar39;
                  auVar18._4_2_ = uVar39;
                  auVar18._6_2_ = uVar39;
                  auVar18._8_2_ = uVar39;
                  auVar18._10_2_ = uVar39;
                  auVar18._12_2_ = uVar39;
                  auVar18._14_2_ = uVar39;
                  auVar18._16_2_ = uVar39;
                  auVar18._18_2_ = uVar39;
                  auVar18._20_2_ = uVar39;
                  auVar18._22_2_ = uVar39;
                  auVar18._24_2_ = uVar39;
                  auVar18._26_2_ = uVar39;
                  auVar18._28_2_ = uVar39;
                  auVar18._30_2_ = uVar39;
                  auVar63 = vpsubsw_avx2(auVar12,auVar18);
                  auVar9._2_2_ = uVar40;
                  auVar9._0_2_ = uVar40;
                  auVar9._4_2_ = uVar40;
                  auVar9._6_2_ = uVar40;
                  auVar9._8_2_ = uVar40;
                  auVar9._10_2_ = uVar40;
                  auVar9._12_2_ = uVar40;
                  auVar9._14_2_ = uVar40;
                  auVar9._16_2_ = uVar40;
                  auVar9._18_2_ = uVar40;
                  auVar9._20_2_ = uVar40;
                  auVar9._22_2_ = uVar40;
                  auVar9._24_2_ = uVar40;
                  auVar9._26_2_ = uVar40;
                  auVar9._28_2_ = uVar40;
                  auVar9._30_2_ = uVar40;
                  auVar69 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*b + lVar28),auVar9);
                  auVar70 = vpcmpgtw_avx2(auVar63,auVar69);
                  auVar9 = vpmaxsw_avx2(auVar63,auVar69);
                  auVar63 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar28),auVar11,
                                           auVar70);
                  auVar69 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar28),auVar44,
                                           auVar70);
                  auVar70 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar28),auVar52,
                                           auVar70);
                  auVar70 = vpaddsw_avx2(auVar14,auVar70);
                  auVar64 = vpcmpgtw_avx2(auVar9,auVar46);
                  *(undefined1 (*) [32])((long)*b + lVar28) = auVar9;
                  *(undefined1 (*) [32])((long)*b_00 + lVar28) = auVar63;
                  local_228 = vpblendvb_avx2(auVar53,auVar63,auVar64);
                  *(undefined1 (*) [32])((long)*b_01 + lVar28) = auVar69;
                  local_248 = vpblendvb_avx2(auVar58,auVar69,auVar64);
                  local_2c8 = vpblendvb_avx2(auVar62,auVar70,auVar64);
                  auVar47 = ZEXT3264(auVar67);
                  *(undefined1 (*) [32])((long)*b_02 + lVar28) = auVar70;
                  auVar10 = vpmaxsw_avx2(auVar10,auVar57);
                  auVar57 = vpmaxsw_avx2(auVar9,auVar46);
                  auVar65 = ZEXT3264(auVar66);
                  *(undefined1 (*) [32])((long)*ptr + lVar28) = auVar46;
                  *(undefined1 (*) [32])((long)*b_03 + lVar28) = auVar53;
                  *(undefined1 (*) [32])((long)*b_04 + lVar28) = auVar58;
                  *(undefined1 (*) [32])((long)*b_05 + lVar28) = auVar62;
                  lVar28 = lVar28 + 0x20;
                } while (size << 5 != lVar28);
                auVar12 = vperm2i128_avx2(local_228,local_228,0x28);
                local_228 = vpalignr_avx2(local_228,auVar12,0xe);
                auVar12 = vperm2i128_avx2(local_248,local_248,0x28);
                local_248 = vpalignr_avx2(local_248,auVar12,0xe);
                auVar11 = vperm2i128_avx2(local_2c8,local_2c8,0x28);
                auVar59._0_16_ = ZEXT116(0) * auVar57._0_16_ + ZEXT116(1) * local_228._0_16_;
                auVar59._16_16_ = ZEXT116(0) * local_228._16_16_ + ZEXT116(1) * auVar57._0_16_;
                auVar12 = vpalignr_avx2(auVar57,auVar59,0xe);
                auVar50 = vpinsrw_avx(auVar12._0_16_,(uint)(ushort)ptr_06[uVar29 + 1],0);
                local_2c8 = vpalignr_avx2(local_2c8,auVar11,0xe);
                auVar46 = vpblendd_avx2(auVar12,ZEXT1632(auVar50),0xf);
                auVar12 = vpaddsw_avx2(auVar46,(undefined1  [32])*ptr_04);
                auVar52 = vpcmpgtw_avx2(auVar10,auVar12);
                auVar57 = vpmaxsw_avx2(auVar10,auVar12);
                auVar44 = vpblendvb_avx2(local_228,auVar67,auVar52);
                auVar11 = vpblendvb_avx2(local_248,auVar66,auVar52);
                auVar12 = vpaddsw_avx2(local_2c8,(undefined1  [32])*ptr_05);
                uVar29 = uVar29 + 1;
                auVar12 = vpblendvb_avx2(auVar12,local_208,auVar52);
                iVar24 = 0xe;
                do {
                  auVar58 = vperm2i128_avx2(auVar12,auVar12,0x28);
                  auVar62 = vperm2i128_avx2(auVar11,auVar11,0x28);
                  auVar70 = vperm2i128_avx2(auVar44,auVar44,0x28);
                  auVar52 = vperm2i128_avx2(auVar57,auVar57,0x28);
                  auVar52 = vpalignr_avx2(auVar57,auVar52,0xe);
                  auVar52 = vpaddsw_avx2(auVar52,auVar43);
                  auVar53 = vpcmpgtw_avx2(auVar57,auVar52);
                  auVar57 = vpmaxsw_avx2(auVar57,auVar52);
                  auVar52 = vpalignr_avx2(auVar44,auVar70,0xe);
                  auVar44 = vpblendvb_avx2(auVar52,auVar44,auVar53);
                  auVar52 = vpalignr_avx2(auVar11,auVar62,0xe);
                  auVar11 = vpblendvb_avx2(auVar52,auVar11,auVar53);
                  auVar52 = vpalignr_avx2(auVar12,auVar58,0xe);
                  auVar52 = vpaddsw_avx2(auVar52,auVar51);
                  auVar12 = vpblendvb_avx2(auVar52,auVar12,auVar53);
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
                auVar52 = vperm2i128_avx2(auVar57,auVar57,0x28);
                auVar53 = vperm2i128_avx2(auVar44,auVar44,0x28);
                auVar62 = vperm2i128_avx2(auVar11,auVar11,0x28);
                auVar70 = vperm2i128_avx2(auVar12,auVar12,0x28);
                auVar52 = vpalignr_avx2(auVar57,auVar52,0xe);
                auVar52 = vpaddsw_avx2(auVar52,auVar45);
                auVar57 = vpcmpgtw_avx2(auVar52,auVar46);
                auVar44 = vpalignr_avx2(auVar44,auVar53,0xe);
                auVar53 = vpblendvb_avx2(local_228,auVar44,auVar57);
                auVar58 = vpmaxsw_avx2(auVar52,auVar46);
                auVar11 = vpalignr_avx2(auVar11,auVar62,0xe);
                auVar46 = vpblendvb_avx2(local_248,auVar11,auVar57);
                auVar12 = vpalignr_avx2(auVar12,auVar70,0xe);
                auVar57 = vpblendvb_avx2(local_2c8,auVar12,auVar57);
                lVar28 = 0;
                auVar17._2_2_ = uVar40;
                auVar17._0_2_ = uVar40;
                auVar17._4_2_ = uVar40;
                auVar17._6_2_ = uVar40;
                auVar17._8_2_ = uVar40;
                auVar17._10_2_ = uVar40;
                auVar17._12_2_ = uVar40;
                auVar17._14_2_ = uVar40;
                auVar17._16_2_ = uVar40;
                auVar17._18_2_ = uVar40;
                auVar17._20_2_ = uVar40;
                auVar17._22_2_ = uVar40;
                auVar17._24_2_ = uVar40;
                auVar17._26_2_ = uVar40;
                auVar17._28_2_ = uVar40;
                auVar17._30_2_ = uVar40;
                auVar71 = ZEXT3264(auVar71._0_32_);
                auVar47 = ZEXT3264(local_198);
                auVar15._8_2_ = 1;
                auVar15._0_8_ = 0x1000100010001;
                auVar15._10_2_ = 1;
                auVar15._12_2_ = 1;
                auVar15._14_2_ = 1;
                auVar15._16_2_ = 1;
                auVar15._18_2_ = 1;
                auVar15._20_2_ = 1;
                auVar15._22_2_ = 1;
                auVar15._24_2_ = 1;
                auVar15._26_2_ = 1;
                auVar15._28_2_ = 1;
                auVar15._30_2_ = 1;
                do {
                  auVar62 = *(undefined1 (*) [32])((long)*ptr + lVar28);
                  auVar19._2_2_ = uVar39;
                  auVar19._0_2_ = uVar39;
                  auVar19._4_2_ = uVar39;
                  auVar19._6_2_ = uVar39;
                  auVar19._8_2_ = uVar39;
                  auVar19._10_2_ = uVar39;
                  auVar19._12_2_ = uVar39;
                  auVar19._14_2_ = uVar39;
                  auVar19._16_2_ = uVar39;
                  auVar19._18_2_ = uVar39;
                  auVar19._20_2_ = uVar39;
                  auVar19._22_2_ = uVar39;
                  auVar19._24_2_ = uVar39;
                  auVar19._26_2_ = uVar39;
                  auVar19._28_2_ = uVar39;
                  auVar19._30_2_ = uVar39;
                  auVar58 = vpsubsw_avx2(auVar58,auVar19);
                  auVar70 = vpsubsw_avx2(auVar52,auVar17);
                  auVar52 = vpcmpgtw_avx2(auVar58,auVar70);
                  auVar44 = vpblendvb_avx2(auVar44,auVar53,auVar52);
                  auVar11 = vpblendvb_avx2(auVar11,auVar46,auVar52);
                  auVar12 = vpblendvb_avx2(auVar12,auVar57,auVar52);
                  auVar52 = vpmaxsw_avx2(auVar58,auVar70);
                  auVar57 = vpmaxsw_avx2(auVar62,*(undefined1 (*) [32])((long)*b + lVar28));
                  auVar58 = vpmaxsw_avx2(auVar52,auVar57);
                  auVar70 = vpcmpgtw_avx2(auVar57,auVar52);
                  auVar57 = vpblendvb_avx2(auVar44,*(undefined1 (*) [32])((long)*b_00 + lVar28),
                                           auVar70);
                  auVar62 = vpcmpeqw_avx2(auVar58,auVar62);
                  auVar53 = vpblendvb_avx2(auVar57,*(undefined1 (*) [32])((long)*b_03 + lVar28),
                                           auVar62);
                  auVar57 = vpblendvb_avx2(auVar11,*(undefined1 (*) [32])((long)*b_01 + lVar28),
                                           auVar70);
                  auVar46 = vpblendvb_avx2(auVar57,*(undefined1 (*) [32])((long)*b_04 + lVar28),
                                           auVar62);
                  auVar12 = vpaddsw_avx2(auVar12,auVar15);
                  auVar57 = vpblendvb_avx2(auVar12,*(undefined1 (*) [32])((long)*b_02 + lVar28),
                                           auVar70);
                  auVar57 = vpblendvb_avx2(auVar57,*(undefined1 (*) [32])((long)*b_05 + lVar28),
                                           auVar62);
                  *(undefined1 (*) [32])((long)*ptr + lVar28) = auVar58;
                  *(undefined1 (*) [32])((long)*b_03 + lVar28) = auVar53;
                  *(undefined1 (*) [32])((long)*b_04 + lVar28) = auVar46;
                  *(undefined1 (*) [32])((long)*b_05 + lVar28) = auVar57;
                  auVar67 = vpminsw_avx2(auVar71._0_32_,auVar58);
                  auVar71 = ZEXT3264(auVar67);
                  auVar62 = vpmaxsw_avx2(auVar58,auVar47._0_32_);
                  auVar62 = vpmaxsw_avx2(auVar53,auVar62);
                  auVar70 = vpmaxsw_avx2(auVar46,auVar57);
                  local_198 = vpmaxsw_avx2(auVar62,auVar70);
                  auVar47 = ZEXT3264(local_198);
                  lVar28 = lVar28 + 0x20;
                } while (size << 5 != lVar28);
              } while (uVar29 != (uint)s2Len);
              alVar13 = ptr[uVar8];
              auVar50 = alVar13._16_16_;
              alVar1 = b_03[uVar8];
              auVar54 = alVar1._16_16_;
              alVar2 = b_04[uVar8];
              auVar42 = alVar2._16_16_;
              alVar3 = b_05[uVar8];
              auVar48 = alVar3._16_16_;
              if (iVar25 < 0xf) {
                iVar25 = 0;
                do {
                  auVar43 = vperm2i128_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar13,0x28
                                           );
                  alVar13 = (__m256i)vpalignr_avx2((undefined1  [32])alVar13,auVar43,0xe);
                  auVar50 = alVar13._16_16_;
                  auVar43 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar43,0xe);
                  auVar54 = alVar1._16_16_;
                  auVar43 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar43,0xe);
                  auVar42 = alVar2._16_16_;
                  auVar43 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar43,0xe);
                  auVar48 = alVar3._16_16_;
                  iVar25 = iVar25 + 1;
                } while (iVar25 < iVar23);
              }
              auVar16._2_2_ = uVar41;
              auVar16._0_2_ = uVar41;
              auVar16._4_2_ = uVar41;
              auVar16._6_2_ = uVar41;
              auVar16._8_2_ = uVar41;
              auVar16._10_2_ = uVar41;
              auVar16._12_2_ = uVar41;
              auVar16._14_2_ = uVar41;
              auVar16._16_2_ = uVar41;
              auVar16._18_2_ = uVar41;
              auVar16._20_2_ = uVar41;
              auVar16._22_2_ = uVar41;
              auVar16._24_2_ = uVar41;
              auVar16._26_2_ = uVar41;
              auVar16._28_2_ = uVar41;
              auVar16._30_2_ = uVar41;
              auVar43 = vpcmpgtw_avx2(auVar16,auVar67);
              auVar20._2_2_ = sVar21;
              auVar20._0_2_ = sVar21;
              auVar20._4_2_ = sVar21;
              auVar20._6_2_ = sVar21;
              auVar20._8_2_ = sVar21;
              auVar20._10_2_ = sVar21;
              auVar20._12_2_ = sVar21;
              auVar20._14_2_ = sVar21;
              auVar20._16_2_ = sVar21;
              auVar20._18_2_ = sVar21;
              auVar20._20_2_ = sVar21;
              auVar20._22_2_ = sVar21;
              auVar20._24_2_ = sVar21;
              auVar20._26_2_ = sVar21;
              auVar20._28_2_ = sVar21;
              auVar20._30_2_ = sVar21;
              auVar51 = vpcmpgtw_avx2(local_198,auVar20);
              auVar43 = vpor_avx2(auVar51,auVar43);
              if ((((((((((((((((((((((((((((((((auVar43 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar43 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar43 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar43 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar43 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar43 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar43 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar43 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar43 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar43 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar43 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar43 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar43 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar43 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar43 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar43 >> 0x7f,0) == '\0') &&
                                (auVar43 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar43 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar43 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar43 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar43 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar43 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar43 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar43 >> 0xbf,0) == '\0') &&
                        (auVar43 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar43 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar43 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar43 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar43 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar43 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar43 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar43[0x1f]) {
                uVar26 = vpextrw_avx(auVar50,7);
                sVar21 = (short)uVar26;
                uVar26 = vpextrw_avx(auVar54,7);
                sVar30 = (short)uVar26;
                uVar26 = vpextrw_avx(auVar42,7);
                sVar32 = (short)uVar26;
                uVar26 = vpextrw_avx(auVar48,7);
                sVar36 = (short)uVar26;
              }
              else {
                *(byte *)&ppVar27->flag = (byte)ppVar27->flag | 0x40;
                sVar21 = 0;
                sVar30 = 0;
                sVar32 = 0;
                sVar36 = 0;
                iVar22 = 0;
                uVar35 = 0;
              }
              ppVar27->score = (int)sVar21;
              ppVar27->end_query = uVar35;
              ppVar27->end_ref = iVar22;
              *(int *)(ppVar27->field_4).extra = (int)sVar30;
              ((ppVar27->field_4).stats)->similar = (int)sVar32;
              ((ppVar27->field_4).stats)->length = (int)sVar36;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar27;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 2);
            vHM = _mm256_slli_si256_rpl(vHM, 2);
            vHS = _mm256_slli_si256_rpl(vHS, 2);
            vHL = _mm256_slli_si256_rpl(vHL, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        matches = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
        similar = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
        length = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}